

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.h
# Opt level: O2

void __thiscall ser::MetainfoSet::ExtractValue<float>(MetainfoSet *this,string *key,float *value)

{
  const_iterator cVar1;
  SerializationException *this_00;
  float fVar2;
  string msg;
  SerializationException exception;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                  *)this,key);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->data_)._M_t._M_impl.super__Rb_tree_header) {
    fVar2 = boost::any_cast<float>((any *)(cVar1._M_node + 2));
    *value = fVar2;
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exception,
                 "Error: metainfo with key = ",key);
  std::operator+(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &exception," does not exist in set\n");
  std::__cxx11::string::~string((string *)&exception);
  exception._0_8_ = &PTR__SerializationException_0013e790;
  exception.message_._M_dataplus._M_p = (pointer)&exception.message_.field_2;
  exception.message_._M_string_length = 0;
  exception.message_.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&exception.message_);
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,&exception);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

inline void ExtractValue(const std::string& key, ValueType& value) const
        {
            std::map<std::string, boost::any>::const_iterator iter = data_.find(key);

            // Check that type exists
            if (iter == data_.end())
            {
                std::string msg = "Error: metainfo with key = " + key + " does not exist in set\n";
                SerializationException exception;
                exception.Init(msg);
                throw exception;
            }

            // Check type
            try
            {
                const boost::any& anyvalue = iter->second;
                value = boost::any_cast<ValueType>(anyvalue);
            }
            catch(boost::bad_any_cast&)
            {
                std::ostringstream msg;
                msg << "Error: type mismatch with metainfo " << key << "\n";
                msg << "Stored metainfo has type " << iter->second.type().name() << "\n";
                msg << "Provided reference has type " << typeid(ValueType).name() << "\n";
                SerializationException exception;
                exception.Init(msg.str());
                throw exception;
            }
        }